

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

void compute_scene_bounding_box_x(ogt_vox_scene *scene,int32_t *out_min_x,int32_t *out_max_x)

{
  ogt_vox_model *poVar1;
  int local_f4;
  uint32_t local_f0;
  uint32_t local_ec;
  uint32_t local_e8;
  uint32_t local_e4;
  int32_t max_x;
  int32_t min_x;
  int32_t half_dim;
  int32_t max_dim;
  ogt_vox_model *model;
  ogt_vox_group *local_88;
  ogt_vox_group *group;
  undefined1 local_78 [4];
  uint32_t parent_group_index;
  ogt_vox_transform instance_transform;
  ogt_vox_instance *instance;
  int local_28;
  uint32_t instance_index;
  int32_t scene_max_x;
  int32_t scene_min_x;
  int32_t *out_max_x_local;
  int32_t *out_min_x_local;
  ogt_vox_scene *scene_local;
  
  if ((scene->num_instances == 0) || (scene->num_models == 0)) {
    *out_min_x = 0;
    *out_max_x = 0;
  }
  else {
    instance_index = 0x7ffffff;
    local_28 = -0x7ffffff;
    for (instance._4_4_ = 0; instance._4_4_ < scene->num_instances;
        instance._4_4_ = instance._4_4_ + 1) {
      instance_transform._56_8_ = scene->instances + instance._4_4_;
      memcpy(local_78,&((ogt_vox_instance *)instance_transform._56_8_)->transform,0x40);
      group._4_4_ = *(uint *)(instance_transform._56_8_ + 0x50);
      while (group._4_4_ != 0xffffffff) {
        local_88 = scene->groups + group._4_4_;
        ogt_vox_transform_multiply
                  ((ogt_vox_transform *)&model,(ogt_vox_transform *)local_78,&local_88->transform);
        memcpy(local_78,&model,0x40);
        group._4_4_ = local_88->parent_group_index;
      }
      poVar1 = scene->models[*(uint *)(instance_transform._56_8_ + 0x48)];
      if (((float)local_78 != 0.0) || (NAN((float)local_78))) {
        local_e4 = poVar1->size_x;
      }
      else {
        if ((instance_transform.m02 != 0.0) || (NAN(instance_transform.m02))) {
          local_e8 = poVar1->size_y;
        }
        else {
          if ((instance_transform.m12 != 0.0) || (NAN(instance_transform.m12))) {
            local_ec = poVar1->size_z;
          }
          else {
            local_ec = poVar1->size_x;
          }
          local_e8 = local_ec;
        }
        local_e4 = local_e8;
      }
      local_f0 = (int)instance_transform.m22 - (int)local_e4 / 2;
      local_f4 = (int)instance_transform.m22 + (int)local_e4 / 2;
      if ((int)instance_index <= (int)local_f0) {
        local_f0 = instance_index;
      }
      instance_index = local_f0;
      if (local_f4 <= local_28) {
        local_f4 = local_28;
      }
      local_28 = local_f4;
    }
    *out_min_x = instance_index;
    *out_max_x = local_28;
  }
  return;
}

Assistant:

static void compute_scene_bounding_box_x(const ogt_vox_scene * scene, int32_t & out_min_x, int32_t & out_max_x) {
        if (scene->num_instances && scene->num_models)
        {
            // We don't apply orientation to the model dimensions and compute the exact min/max.
            // Instead we just conservatively use the maximum dimension of the model.
            int32_t scene_min_x =  0x7ffffff;
            int32_t scene_max_x = -0x7ffffff;
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* instance = &scene->instances[instance_index];
                // compute the instance transform, taking into account the group hierarchy.
                ogt_vox_transform instance_transform = instance->transform;
                uint32_t parent_group_index = instance->group_index;
                while (parent_group_index != k_invalid_group_index) {
                    const ogt_vox_group* group = &scene->groups[parent_group_index];
                    instance_transform = ogt_vox_transform_multiply(instance_transform, group->transform);
                    parent_group_index = group->parent_group_index;
                }

                const ogt_vox_model* model = scene->models[instance->model_index];
                // the instance_transform can be rotated, so we try to figure out whether the
                // model's local x, y or z size is aligned along the world x axis.
                // One of the column vectors of the transform must have a non-zero in its
                // x field and the dimension associated with that column is the correct choice of rus.
                int32_t max_dim = instance_transform.m00 != 0.0f ? model->size_x :
                                  instance_transform.m10 != 0.0f ? model->size_y :
                                  instance_transform.m20 != 0.0f ? model->size_z : model->size_x;
                int32_t half_dim = max_dim / 2;
                int32_t min_x = (int32_t)instance_transform.m30 - half_dim;
                int32_t max_x = (int32_t)instance_transform.m30 + half_dim;
                scene_min_x = min_x < scene_min_x ? min_x : scene_min_x;
                scene_max_x = max_x > scene_max_x ? max_x : scene_max_x;
            }
            // pass out the dimensions.
            out_min_x = scene_min_x;
            out_max_x = scene_max_x;
        }
        else {
            out_min_x = 0;
            out_max_x = 0;
        }
    }